

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

locale __thiscall
booster::locale::impl_posix::create_parsing_impl<char>
          (impl_posix *this,locale *in,shared_ptr<__locale_struct_*> *lc)

{
  num_punct_posix<char> *this_00;
  ctype_posix<char> *__f;
  base_num_parse<char> *__f_00;
  locale local_40;
  element_type *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  this_00 = (num_punct_posix<char> *)operator_new(0x78);
  num_punct_posix<char>::num_punct_posix
            (this_00,*(lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
             ,0);
  std::locale::locale<booster::locale::impl_posix::num_punct_posix<char>>((locale *)this,in,this_00)
  ;
  __f = (ctype_posix<char> *)operator_new(0x250);
  local_38 = (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30._M_pi =
       (lc->super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30._M_pi)->_M_use_count = (local_30._M_pi)->_M_use_count + 1;
    }
  }
  std::ctype<char>::ctype((ushort *)__f,false,0);
  *(undefined ***)__f = &PTR__ctype_posix_001d1860;
  (__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_38;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(__f->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_30);
  std::locale::locale<booster::locale::impl_posix::ctype_posix<char>>(&local_40,(locale *)this,__f);
  std::locale::operator=((locale *)this,&local_40);
  std::locale::~locale(&local_40);
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  __f_00 = (base_num_parse<char> *)operator_new(0x10);
  *(undefined4 *)&__f_00->field_0x8 = 0;
  *(undefined ***)__f_00 = &PTR__facet_001d1b80;
  std::locale::locale<booster::locale::util::base_num_parse<char>>(&local_40,(locale *)this,__f_00);
  std::locale::operator=((locale *)this,&local_40);
  std::locale::~locale(&local_40);
  return (locale)(_Impl *)this;
}

Assistant:

std::locale create_parsing_impl(std::locale const &in,booster::shared_ptr<locale_t> lc)
{
    std::locale tmp = std::locale(in,new num_punct_posix<CharType>(*lc));
    tmp = std::locale(tmp,new ctype_posix<CharType>(lc));
    tmp = std::locale(tmp,new util::base_num_parse<CharType>());
    return tmp;
}